

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed_solomn_reconstruct.cpp
# Opt level: O0

ll128 * __thiscall reed_solomn::lc(reed_solomn *this,vector<__int128,_std::allocator<__int128>_> *A)

{
  ll128 *plVar1;
  ostream *this_00;
  void *this_01;
  reference pvVar2;
  vector<__int128,_std::allocator<__int128>_> *in_RSI;
  vector<__int128,_std::allocator<__int128>_> *in_RDI;
  int deg;
  reed_solomn *in_stack_ffffffffffffffa8;
  
  std::vector<__int128,_std::allocator<__int128>_>::vector(in_RDI,in_RSI);
  plVar1 = degree(in_stack_ffffffffffffffa8,in_RSI);
  std::vector<__int128,_std::allocator<__int128>_>::~vector(in_RSI);
  this_00 = std::operator<<((ostream *)&std::cout,"deg: ");
  this_01 = (void *)std::ostream::operator<<(this_00,(int)plVar1);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  pvVar2 = std::vector<__int128,_std::allocator<__int128>_>::operator[](in_RSI,(long)(int)plVar1);
  return *(ll128 **)pvVar2;
}

Assistant:

ll128 reed_solomn::lc(vector<ll128> A) {
    int deg = degree(A);
    cout << "deg: " << deg << endl;
    return A[deg];
}